

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValuePair.h
# Opt level: O0

void __thiscall
JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::KeyValuePair
          (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *this,
          KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *other)

{
  void **ppvVar1;
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *other_local;
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *this_local;
  
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)other);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->key,*ppvVar1);
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&other->value);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->value,*ppvVar1);
  return;
}

Assistant:

KeyValuePair(const KeyValuePair& other)
            : key(other.key), value(other.value)
        {}